

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O0

void __thiscall kratos::FSM::add_child_fsm(FSM *this,FSM *fsm)

{
  UserException *this_00;
  remove_reference_t<std::__cxx11::basic_string<char>_&> *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::FSM_*>_>,_bool>
  pVar1;
  string_view format_str;
  format_args args;
  shared_ptr<kratos::FSMState> local_f8;
  _Base_ptr local_e8;
  undefined1 local_e0;
  undefined1 local_d5;
  string local_c8;
  FSM *local_a8;
  FSM *fsm_local;
  FSM *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_90;
  basic_string_view<char> local_88;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_58;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  FSM *local_48;
  char *local_40;
  string *local_38;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_10;
  
  local_a8 = fsm;
  fsm_local = this;
  if (fsm->generator_ != this->generator_) {
    local_d5 = 1;
    this_00 = (UserException *)__cxa_allocate_exception(0x10);
    local_38 = &local_c8;
    local_40 = "FSM {0} doesn\'t have the same generator parent as {1}";
    local_48 = local_a8;
    vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)this;
    fmt::v7::make_args_checked<std::__cxx11::string&,std::__cxx11::string&,char[54],char>
              (&local_78,(v7 *)"FSM {0} doesn\'t have the same generator parent as {1}",
               (char (*) [54])local_a8,&this->fsm_name_,in_R8);
    local_58 = &local_78;
    local_88 = fmt::v7::to_string_view<char,_0>(local_40);
    local_28 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)&this_local;
    local_30 = local_58;
    local_20 = local_58;
    local_10 = local_58;
    local_18 = local_28;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_28,0xdd,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)local_58);
    format_str.size_ = (size_t)this_local;
    format_str.data_ = (char *)local_88.size_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_90.values_;
    fmt::v7::detail::vformat_abi_cxx11_(&local_c8,(detail *)local_88.data_,format_str,args);
    UserException::UserException(this_00,&local_c8);
    local_d5 = 0;
    __cxa_throw(this_00,&UserException::typeinfo,UserException::~UserException);
  }
  pVar1 = std::
          map<std::__cxx11::string,kratos::FSM*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,kratos::FSM*>>>
          ::emplace<std::__cxx11::string&,kratos::FSM*&>
                    ((map<std::__cxx11::string,kratos::FSM*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,kratos::FSM*>>>
                      *)&this->child_fsms_,&fsm->fsm_name_,&local_a8);
  local_e8 = (_Base_ptr)pVar1.first._M_node;
  local_e0 = pVar1.second;
  local_a8->parent_fsm_ = this;
  std::shared_ptr<kratos::FSMState>::shared_ptr(&local_f8,(nullptr_t)0x0);
  std::shared_ptr<kratos::FSMState>::operator=(&local_a8->start_state_,&local_f8);
  std::shared_ptr<kratos::FSMState>::~shared_ptr(&local_f8);
  return;
}

Assistant:

void FSM::add_child_fsm(FSM* fsm) {
    if (fsm->generator_ != generator_)
        throw UserException(::format("FSM {0} doesn't have the same generator parent as {1}",
                                     fsm->fsm_name_, fsm_name_));
    child_fsms_.emplace(fsm->fsm_name_, fsm);
    fsm->parent_fsm_ = this;
    // erase the start from the child generator
    fsm->start_state_ = nullptr;
}